

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdbmp.c
# Opt level: O3

JDIMENSION preload_image(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  jpeg_progress_mgr *pjVar1;
  FILE *__stream;
  jpeg_error_mgr *pjVar2;
  int iVar3;
  uint uVar4;
  JDIMENSION JVar5;
  ulong uVar6;
  JSAMPARRAY ppJVar7;
  size_t sVar8;
  int iVar9;
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar10;
  
  pjVar1 = cinfo->progress;
  uVar6 = (ulong)cinfo->image_height;
  if (cinfo->image_height == 0) {
    uVar4 = 0;
  }
  else {
    __stream = (FILE *)sinfo->input_file;
    uVar10 = 0;
    do {
      if (pjVar1 != (jpeg_progress_mgr *)0x0) {
        pjVar1->pass_counter = uVar10;
        pjVar1->pass_limit = uVar6;
        (*pjVar1->progress_monitor)((j_common_ptr)cinfo);
      }
      ppJVar7 = (*cinfo->mem->access_virt_sarray)
                          ((j_common_ptr)cinfo,(jvirt_sarray_ptr)sinfo[1].finish_input,
                           (JDIMENSION)uVar10,1,1);
      sVar8 = fread(*ppJVar7,1,(ulong)*(uint *)((long)&sinfo[1].input_file + 4),__stream);
      if (sVar8 != *(uint *)((long)&sinfo[1].input_file + 4)) {
        iVar3 = feof(__stream);
        pjVar2 = cinfo->err;
        iVar9 = 0x2b;
        if (iVar3 == 0) {
          iVar9 = 0x24;
        }
        pjVar2->msg_code = iVar9;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
      }
      uVar10 = uVar10 + 1;
      uVar4 = cinfo->image_height;
      uVar6 = (ulong)uVar4;
    } while (uVar10 < uVar6);
  }
  if (pjVar1 != (jpeg_progress_mgr *)0x0) {
    *(int *)&pjVar1[1].progress_monitor = *(int *)&pjVar1[1].progress_monitor + 1;
  }
  iVar3 = *(int *)&sinfo[1].buffer;
  if (iVar3 == 0x20) {
    UNRECOVERED_JUMPTABLE = get_32bit_row;
  }
  else if (iVar3 == 0x18) {
    UNRECOVERED_JUMPTABLE = get_24bit_row;
  }
  else {
    if (iVar3 != 8) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x3ea;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
      uVar4 = cinfo->image_height;
      UNRECOVERED_JUMPTABLE = sinfo->get_pixel_rows;
      goto LAB_001156fb;
    }
    UNRECOVERED_JUMPTABLE = get_8bit_row;
  }
  sinfo->get_pixel_rows = UNRECOVERED_JUMPTABLE;
LAB_001156fb:
  *(uint *)&sinfo[1].input_file = uVar4;
  JVar5 = (*UNRECOVERED_JUMPTABLE)(cinfo,sinfo);
  return JVar5;
}

Assistant:

METHODDEF(JDIMENSION)
preload_image(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  bmp_source_ptr source = (bmp_source_ptr)sinfo;
  register FILE *infile = source->pub.input_file;
  register JSAMPROW out_ptr;
  JSAMPARRAY image_ptr;
  JDIMENSION row;
  cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;

  /* Read the data into a virtual array in input-file row order. */
  for (row = 0; row < cinfo->image_height; row++) {
    if (progress != NULL) {
      progress->pub.pass_counter = (long)row;
      progress->pub.pass_limit = (long)cinfo->image_height;
      (*progress->pub.progress_monitor) ((j_common_ptr)cinfo);
    }
    image_ptr = (*cinfo->mem->access_virt_sarray)
      ((j_common_ptr)cinfo, source->whole_image, row, (JDIMENSION)1, TRUE);
    out_ptr = image_ptr[0];
    if (fread(out_ptr, 1, source->row_width, infile) != source->row_width) {
      if (feof(infile))
        ERREXIT(cinfo, JERR_INPUT_EOF);
      else
        ERREXIT(cinfo, JERR_FILE_READ);
    }
  }
  if (progress != NULL)
    progress->completed_extra_passes++;

  /* Set up to read from the virtual array in top-to-bottom order */
  switch (source->bits_per_pixel) {
  case 8:
    source->pub.get_pixel_rows = get_8bit_row;
    break;
  case 24:
    source->pub.get_pixel_rows = get_24bit_row;
    break;
  case 32:
    source->pub.get_pixel_rows = get_32bit_row;
    break;
  default:
    ERREXIT(cinfo, JERR_BMP_BADDEPTH);
  }
  source->source_row = cinfo->image_height;

  /* And read the first row */
  return (*source->pub.get_pixel_rows) (cinfo, sinfo);
}